

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmPreModify(ExpressionContext *ctx,VmModule *module,ExprPreModify *node)

{
  VmValueType VVar1;
  VmValue *pVVar2;
  VmValue *lhs;
  VmConstant *pVVar3;
  uint uVar4;
  SynBase *pSVar5;
  uint in_R9D;
  TypeBase *pTVar6;
  double value;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  pTVar6 = node->value->type;
  if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
    pTVar6 = (TypeBase *)0x0;
  }
  if (pTVar6 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa58,
                  "VmValue *CompileVmPreModify(ExpressionContext &, VmModule *, ExprPreModify *)");
  }
  lhs = anon_unknown.dwarf_13465d::CreateLoad
                  (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar6[1]._vptr_TypeBase,
                   pVVar2,in_R9D);
  VVar1 = (lhs->type).type;
  uVar4 = (lhs->type).size;
  if (uVar4 == 4 && VVar1 == VM_TYPE_INT) {
    pSVar5 = (node->super_ExprBase).source;
    pVVar3 = CreateConstantInt(module->allocator,pSVar5,node->isIncrement - 1 | 1);
  }
  else {
    uVar4 = uVar4 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar4 == 0) {
      pSVar5 = (node->super_ExprBase).source;
      if (node->isIncrement == false) {
        value = -1.0;
      }
      else {
        value = 1.0;
      }
      pVVar3 = CreateConstantDouble(module->allocator,pSVar5,value);
      lhs = anon_unknown.dwarf_13465d::CreateAdd(module,pSVar5,lhs,&pVVar3->super_VmValue);
      goto LAB_001ad378;
    }
    if (VVar1 != VM_TYPE_LONG || uVar4 != 0) goto LAB_001ad378;
    pSVar5 = (node->super_ExprBase).source;
    pVVar3 = CreateConstantLong(module->allocator,pSVar5,(ulong)node->isIncrement - 1 | 1);
  }
  lhs = anon_unknown.dwarf_13465d::CreateAdd(module,pSVar5,lhs,&pVVar3->super_VmValue);
LAB_001ad378:
  anon_unknown.dwarf_13465d::CreateStore
            (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar6[1]._vptr_TypeBase,pVVar2,
             lhs,0);
  pVVar2 = anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,lhs);
  return pVVar2;
}

Assistant:

VmValue* CompileVmPreModify(ExpressionContext &ctx, VmModule *module, ExprPreModify *node)
{
	VmValue *address = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	VmValue *value = CreateLoad(ctx, module, node->source, refType->subType, address, 0);

	if(value->type == VmType::Int)
		value = CreateAdd(module, node->source, value, CreateConstantInt(module->allocator, node->source, node->isIncrement ? 1 : -1));
	else if(value->type == VmType::Double)
		value = CreateAdd(module, node->source, value, CreateConstantDouble(module->allocator, node->source, node->isIncrement ? 1.0 : -1.0));
	else if(value->type == VmType::Long)
		value = CreateAdd(module, node->source, value, CreateConstantLong(module->allocator, node->source, node->isIncrement ? 1ll : -1ll));
	else
		assert("!unknown type");

	CreateStore(ctx, module, node->source, refType->subType, address, value, 0);

	return CheckType(ctx, node, value);
}